

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O3

void Mio_WriteGate(FILE *pFile,Mio_Gate_t *pGate,int GateLen,int NameLen,int FormLen,int fPrintSops,
                  int fAllPins)

{
  Mio_Pin_t *pPin;
  int iVar1;
  char *__s;
  int iVar2;
  char Buffer [5000];
  char local_13b8 [5000];
  
  iVar2 = FormLen + NameLen;
  if (iVar2 < 0x1386) {
    sprintf(local_13b8,"%s=%s;",pGate->pOutName,pGate->pForm);
    fprintf((FILE *)pFile,"GATE %-*s ",(ulong)(uint)GateLen,pGate->pName);
    fprintf((FILE *)pFile,"%8.2f  ",pGate->dArea);
    iVar1 = 0x3a;
    if (iVar2 < 0x3a) {
      iVar1 = iVar2;
    }
    fprintf((FILE *)pFile,"%-*s ",(ulong)(iVar1 + 2));
    if (fPrintSops != 0) {
      __s = "unspecified\n";
      if (pGate->pSop != (char *)0x0) {
        __s = pGate->pSop;
      }
      fputs(__s,(FILE *)pFile);
    }
    if ((fAllPins == 0) || (pGate->pPins == (Mio_Pin_t *)0x0)) {
      for (pPin = Mio_GateReadPins(pGate); pPin != (Mio_Pin_t *)0x0; pPin = Mio_PinReadNext(pPin)) {
        Mio_WritePin(pFile,pPin,NameLen,0);
      }
    }
    else {
      Mio_WritePin(pFile,pGate->pPins,NameLen,1);
    }
    fputc(10,(FILE *)pFile);
    return;
  }
  __assert_fail("NameLen+FormLen+2 < 5000",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mio/mioUtils.c"
                ,0xe1,"void Mio_WriteGate(FILE *, Mio_Gate_t *, int, int, int, int, int)");
}

Assistant:

void Mio_WriteGate( FILE * pFile, Mio_Gate_t * pGate, int GateLen, int NameLen, int FormLen, int fPrintSops, int fAllPins )
{
    char Buffer[5000];
    Mio_Pin_t * pPin;
    assert( NameLen+FormLen+2 < 5000 );
    sprintf( Buffer, "%s=%s;",    pGate->pOutName, pGate->pForm );
    fprintf( pFile, "GATE %-*s ", GateLen, pGate->pName );
    fprintf( pFile, "%8.2f  ",    pGate->dArea );
    fprintf( pFile, "%-*s ",      Abc_MinInt(NameLen+FormLen+2, 60), Buffer );
    // print the pins
    if ( fPrintSops )
        fprintf( pFile, "%s",       pGate->pSop? pGate->pSop : "unspecified\n" );
    if ( fAllPins && pGate->pPins ) // equal pins
        Mio_WritePin( pFile, pGate->pPins, NameLen, 1 );
    else // different pins
        Mio_GateForEachPin( pGate, pPin )
            Mio_WritePin( pFile, pPin, NameLen, 0 );
    fprintf( pFile, "\n" );
}